

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<prometheus::(anonymous_namespace)::CheckLabelNameTest_invalid_label_name_Test>
::CreateTest(ParameterizedTestFactory<prometheus::(anonymous_namespace)::CheckLabelNameTest_invalid_label_name_Test>
             *this)

{
  Test *this_00;
  
  WithParamInterface<prometheus::MetricType>::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x18);
  prometheus::anon_unknown_0::CheckLabelNameTest::CheckLabelNameTest((CheckLabelNameTest *)this_00);
  (((TestWithParam<prometheus::MetricType> *)&this_00->_vptr_Test)->super_Test)._vptr_Test =
       (_func_int **)&PTR__TestWithParam_0019fa80;
  this_00[1]._vptr_Test = (_func_int **)&DAT_0019fac0;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }